

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::TokenManager::SignMessage
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aSignature,Message *aMessage)

{
  bool bVar1;
  Error *pEVar2;
  ErrorCode local_24c;
  Error local_248;
  ErrorCode local_21c;
  Error local_218;
  ErrorCode local_1ec;
  Error local_1e8;
  ErrorCode local_1bc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1b8;
  Error local_198;
  ErrorCode local_16c;
  Error local_168;
  ErrorCode local_13c;
  Error local_138;
  ErrorCode local_10c;
  Error local_108;
  ErrorCode local_dc;
  Error local_d8;
  ErrorCode local_ac;
  Error local_a8;
  undefined1 local_80 [8];
  ByteArray keyId;
  undefined1 local_58 [8];
  Sign1Message sign1Msg;
  ByteArray externalData;
  Message *aMessage_local;
  ByteArray *aSignature_local;
  TokenManager *this_local;
  Error *error;
  
  Error::Error(__return_storage_ptr__);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sign1Msg.mSign);
  cose::Sign1Message::Sign1Message((Sign1Message *)local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  PrepareSigningContent(&local_a8,(ByteArray *)&sign1Msg.mSign,aMessage);
  pEVar2 = Error::operator=(__return_storage_ptr__,&local_a8);
  local_ac = kNone;
  bVar1 = commissioner::operator!=(pEVar2,&local_ac);
  Error::~Error(&local_a8);
  if (!bVar1) {
    cose::Sign1Message::Init(&local_d8,(Sign1Message *)local_58,0);
    pEVar2 = Error::operator=(__return_storage_ptr__,&local_d8);
    local_dc = kNone;
    bVar1 = commissioner::operator!=(pEVar2,&local_dc);
    Error::~Error(&local_d8);
    if (!bVar1) {
      cose::Sign1Message::AddAttribute(&local_108,(Sign1Message *)local_58,1,-7,1);
      pEVar2 = Error::operator=(__return_storage_ptr__,&local_108);
      local_10c = kNone;
      bVar1 = commissioner::operator!=(pEVar2,&local_10c);
      Error::~Error(&local_108);
      if (!bVar1) {
        GetKeyId(&local_138,this,(ByteArray *)local_80);
        pEVar2 = Error::operator=(__return_storage_ptr__,&local_138);
        local_13c = kNone;
        bVar1 = commissioner::operator!=(pEVar2,&local_13c);
        Error::~Error(&local_138);
        if (!bVar1) {
          cose::Sign1Message::AddAttribute
                    (&local_168,(Sign1Message *)local_58,4,(ByteArray *)local_80,2);
          pEVar2 = Error::operator=(__return_storage_ptr__,&local_168);
          local_16c = kNone;
          bVar1 = commissioner::operator!=(pEVar2,&local_16c);
          Error::~Error(&local_168);
          if (!bVar1) {
            local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1b8);
            cose::Sign1Message::SetContent(&local_198,(Sign1Message *)local_58,&local_1b8);
            pEVar2 = Error::operator=(__return_storage_ptr__,&local_198);
            local_1bc = kNone;
            bVar1 = commissioner::operator!=(pEVar2,&local_1bc);
            Error::~Error(&local_198);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1b8);
            if (!bVar1) {
              cose::Sign1Message::SetExternalData
                        (&local_1e8,(Sign1Message *)local_58,(ByteArray *)&sign1Msg.mSign);
              pEVar2 = Error::operator=(__return_storage_ptr__,&local_1e8);
              local_1ec = kNone;
              bVar1 = commissioner::operator!=(pEVar2,&local_1ec);
              Error::~Error(&local_1e8);
              if (!bVar1) {
                cose::Sign1Message::Sign
                          (&local_218,(Sign1Message *)local_58,
                           (mbedtls_pk_context *)&this->mPrivateKey);
                pEVar2 = Error::operator=(__return_storage_ptr__,&local_218);
                local_21c = kNone;
                bVar1 = commissioner::operator!=(pEVar2,&local_21c);
                Error::~Error(&local_218);
                if (!bVar1) {
                  cose::Sign1Message::Serialize(&local_248,(Sign1Message *)local_58,aSignature);
                  pEVar2 = Error::operator=(__return_storage_ptr__,&local_248);
                  local_24c = kNone;
                  bVar1 = commissioner::operator!=(pEVar2,&local_24c);
                  Error::~Error(&local_248);
                  if (!bVar1) {
                    this->mSequenceNumber = this->mSequenceNumber + 1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  cose::Sign1Message::Free((Sign1Message *)local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  cose::Sign1Message::~Sign1Message((Sign1Message *)local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sign1Msg.mSign);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::SignMessage(ByteArray &aSignature, const coap::Message &aMessage)
{
    Error              error;
    ByteArray          externalData;
    cose::Sign1Message sign1Msg;
    ByteArray          keyId;

    SuccessOrExit(error = PrepareSigningContent(externalData, aMessage));

    SuccessOrExit(error = sign1Msg.Init(cose::kInitFlagsNone));
    SuccessOrExit(error = sign1Msg.AddAttribute(cose::kHeaderAlgorithm, cose::kAlgEcdsaWithSha256, cose::kProtectOnly));
#if OT_COMM_CONFIG_REFERENCE_DEVICE_ENABLE
    // In case of getting Key ID failed, Use all-zero value by default.
    keyId.resize(kMaxCoseKeyIdLength);
    std::fill(keyId.begin(), keyId.end(), 0);
    IgnoreError(GetKeyId(keyId));
#else
    SuccessOrExit(error = GetKeyId(keyId));
#endif
    SuccessOrExit(error = sign1Msg.AddAttribute(cose::kHeaderKeyId, keyId, cose::kUnprotectOnly));

    // TODO(wgtdkp): set cose::kHeaderIV to mSequenceNumber.
    // SuccessOrExit(error = sign1Msg.AddAttribute(cose::kHeaderIV, , cose::kProtectOnly));
    SuccessOrExit(error = sign1Msg.SetContent({}));

    // The serialized message as external data for COSE signing.
    SuccessOrExit(error = sign1Msg.SetExternalData(externalData));

    SuccessOrExit(error = sign1Msg.Sign(mPrivateKey));
    SuccessOrExit(error = sign1Msg.Serialize(aSignature));

    // TODO(wgtdkp): synchronize to persist store.
    ++mSequenceNumber;

exit:
    sign1Msg.Free();
    return error;
}